

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.c
# Opt level: O0

IXML_Attr * ixmlElement_getAttributeNodeNS(IXML_Element *element,char *namespaceURI,char *localName)

{
  int iVar1;
  IXML_Element *local_30;
  IXML_Node *attrNode;
  char *localName_local;
  char *namespaceURI_local;
  IXML_Element *element_local;
  
  if (((element == (IXML_Element *)0x0) || (namespaceURI == (char *)0x0)) ||
     (localName == (char *)0x0)) {
    element_local = (IXML_Element *)0x0;
  }
  else {
    local_30 = (IXML_Element *)(element->n).firstAttr;
    while ((local_30 != (IXML_Element *)0x0 &&
           ((iVar1 = strcmp((local_30->n).localName,localName), iVar1 != 0 ||
            (iVar1 = strcmp((local_30->n).namespaceURI,namespaceURI), iVar1 != 0))))) {
      local_30 = (IXML_Element *)(local_30->n).nextSibling;
    }
    element_local = local_30;
  }
  return (IXML_Attr *)element_local;
}

Assistant:

IXML_Attr *ixmlElement_getAttributeNodeNS(IXML_Element *element,
	const DOMString namespaceURI,
	const DOMString localName)
{
	IXML_Node *attrNode = NULL;

	if (element == NULL || namespaceURI == NULL || localName == NULL) {
		return NULL;
	}

	attrNode = element->n.firstAttr;
	while (attrNode != NULL) {
		if (strcmp(attrNode->localName, localName) == 0 &&
			strcmp(attrNode->namespaceURI, namespaceURI) == 0) {
			/* found it */
			break;
		} else {
			attrNode = attrNode->nextSibling;
		}
	}

	return (IXML_Attr *)attrNode;
}